

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O3

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *this,size_t dist,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2)

{
  unsigned_long *puVar1;
  size_type __new_size;
  ulong uVar2;
  pointer puVar3;
  ulong uVar4;
  int iVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  int iVar13;
  datatype mxxindex_t;
  MPI_Request recv_reqs [2];
  datatype local_60;
  undefined1 local_48 [24];
  
  __new_size = this->local_size;
  if (__new_size !=
      (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                 );
  }
  uVar2 = (this->part).prefix;
  puVar3 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar6 - (long)puVar3 >> 3 != __new_size) {
    if (puVar6 != puVar3) {
      (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
    local_60._vptr_datatype = (_func_int **)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (param_2,__new_size,(value_type_conflict1 *)&local_60);
  }
  local_60._vptr_datatype = (_func_int **)&PTR__datatype_00150920;
  local_60.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  local_60.builtin = true;
  uVar7 = uVar2 + dist;
  uVar10 = 0;
  if (uVar7 < this->n) {
    puVar1 = &(this->part).div1mod;
    if (uVar7 < *puVar1) {
      uVar10 = (this->part).div;
      uVar8 = (this->part).mod;
      iVar13 = (int)(uVar7 / (uVar10 + 1));
    }
    else {
      uVar10 = (this->part).div;
      uVar8 = (this->part).mod;
      iVar13 = (int)((uVar7 - *puVar1) / uVar10) + (int)uVar8;
    }
    uVar4 = (ulong)(iVar13 + 1);
    uVar11 = uVar4;
    if (uVar8 < uVar4) {
      uVar11 = uVar8;
    }
    uVar11 = (uVar10 * uVar4 - uVar7) + uVar11;
    uVar10 = 0;
    if ((this->comm).m_rank != iVar13) {
      if (0x7ffffffe < uVar11) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start,uVar11 & 0xffffffff,&ompi_mpi_unsigned_long,iVar13
                ,2,(this->comm).mpi_comm,local_48);
      uVar10 = 1;
    }
    uVar7 = this->local_size - uVar11;
    if ((uVar11 <= this->local_size && uVar7 != 0) && (this->p + -1 != iVar13)) {
      if (0x7ffffffe < uVar7) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start + uVar11,uVar7,&ompi_mpi_unsigned_long,iVar13 + 1,
                2,(this->comm).mpi_comm,local_48 + uVar10 * 8);
      uVar10 = (ulong)((int)uVar10 + 1);
    }
  }
  if (dist <= (this->local_size + uVar2) - 1) {
    sVar12 = dist - uVar2;
    if (dist < uVar2 || sVar12 == 0) {
      uVar7 = uVar2 - dist;
      uVar9 = (this->part).div1mod;
      if (uVar7 < uVar9) {
        uVar7 = uVar7 / ((this->part).div + 1);
      }
      else {
        uVar7 = (uVar7 - uVar9) / (this->part).div + (this->part).mod;
      }
    }
    else {
      uVar9 = (this->part).div1mod;
      uVar7 = 0xffffffff;
    }
    uVar8 = this->local_size + uVar2 + ~dist;
    if (uVar8 < uVar9) {
      uVar11 = (this->part).div;
      iVar13 = (int)(uVar8 / (uVar11 + 1));
    }
    else {
      uVar11 = (this->part).div;
      iVar13 = (int)((uVar8 - uVar9) / uVar11) + (int)(this->part).mod;
    }
    iVar5 = (int)uVar7;
    if (iVar5 == iVar13) {
      sVar12 = 0;
    }
    else if (-1 < iVar5) {
      if (iVar5 == (this->comm).m_rank) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      uVar8 = (this->part).mod;
      uVar4 = (ulong)(iVar5 + 1);
      if (uVar4 <= uVar8) {
        uVar8 = uVar4;
      }
      sVar12 = (dist - uVar2) + uVar8 + uVar11 * uVar4;
      MPI_Send((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,sVar12 & 0xffffffff,&ompi_mpi_unsigned_long,
               uVar7,2,(this->comm).mpi_comm);
    }
    if ((this->comm).m_rank == iVar13) {
      if (sVar12 != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      if (dist < this->local_size) {
        puVar3 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar6 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          *puVar6 = puVar3[dist];
          dist = dist + 1;
          puVar6 = puVar6 + 1;
        } while (dist < this->local_size);
      }
    }
    else {
      MPI_Send((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar12,(int)this->local_size - (int)sVar12
               ,&ompi_mpi_unsigned_long,iVar13,2,(this->comm).mpi_comm);
    }
  }
  MPI_Waitall(uVar10,local_48,0);
  mxx::datatype::~datatype(&local_60);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}